

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O0

void secp256k1_scalar_set_b32(secp256k1_scalar *r,uchar *b32,int *overflow)

{
  uint overflow_00;
  int iVar1;
  int *in_RDX;
  undefined1 *in_RSI;
  secp256k1_scalar *in_RDI;
  int over;
  
  in_RDI->d[0] = CONCAT17(in_RSI[0x18],
                          CONCAT16(in_RSI[0x19],
                                   CONCAT15(in_RSI[0x1a],
                                            CONCAT14(in_RSI[0x1b],
                                                     CONCAT13(in_RSI[0x1c],
                                                              CONCAT12(in_RSI[0x1d],
                                                                       CONCAT11(in_RSI[0x1e],
                                                                                in_RSI[0x1f])))))));
  in_RDI->d[1] = CONCAT17(in_RSI[0x10],
                          CONCAT16(in_RSI[0x11],
                                   CONCAT15(in_RSI[0x12],
                                            CONCAT14(in_RSI[0x13],
                                                     CONCAT13(in_RSI[0x14],
                                                              CONCAT12(in_RSI[0x15],
                                                                       CONCAT11(in_RSI[0x16],
                                                                                in_RSI[0x17])))))));
  in_RDI->d[2] = CONCAT17(in_RSI[8],
                          CONCAT16(in_RSI[9],
                                   CONCAT15(in_RSI[10],
                                            CONCAT14(in_RSI[0xb],
                                                     CONCAT13(in_RSI[0xc],
                                                              CONCAT12(in_RSI[0xd],
                                                                       CONCAT11(in_RSI[0xe],
                                                                                in_RSI[0xf])))))));
  in_RDI->d[3] = CONCAT17(*in_RSI,CONCAT16(in_RSI[1],
                                           CONCAT15(in_RSI[2],
                                                    CONCAT14(in_RSI[3],
                                                             CONCAT13(in_RSI[4],
                                                                      CONCAT12(in_RSI[5],
                                                                               CONCAT11(in_RSI[6],
                                                                                        in_RSI[7])))
                                                            ))));
  overflow_00 = secp256k1_scalar_check_overflow(in_RDI);
  iVar1 = secp256k1_scalar_reduce(in_RDI,overflow_00);
  if (in_RDX != (int *)0x0) {
    *in_RDX = iVar1;
  }
  return;
}

Assistant:

static void secp256k1_scalar_set_b32(secp256k1_scalar *r, const unsigned char *b32, int *overflow) {
    int over;
    r->d[0] = (uint64_t)b32[31] | (uint64_t)b32[30] << 8 | (uint64_t)b32[29] << 16 | (uint64_t)b32[28] << 24 | (uint64_t)b32[27] << 32 | (uint64_t)b32[26] << 40 | (uint64_t)b32[25] << 48 | (uint64_t)b32[24] << 56;
    r->d[1] = (uint64_t)b32[23] | (uint64_t)b32[22] << 8 | (uint64_t)b32[21] << 16 | (uint64_t)b32[20] << 24 | (uint64_t)b32[19] << 32 | (uint64_t)b32[18] << 40 | (uint64_t)b32[17] << 48 | (uint64_t)b32[16] << 56;
    r->d[2] = (uint64_t)b32[15] | (uint64_t)b32[14] << 8 | (uint64_t)b32[13] << 16 | (uint64_t)b32[12] << 24 | (uint64_t)b32[11] << 32 | (uint64_t)b32[10] << 40 | (uint64_t)b32[9] << 48 | (uint64_t)b32[8] << 56;
    r->d[3] = (uint64_t)b32[7] | (uint64_t)b32[6] << 8 | (uint64_t)b32[5] << 16 | (uint64_t)b32[4] << 24 | (uint64_t)b32[3] << 32 | (uint64_t)b32[2] << 40 | (uint64_t)b32[1] << 48 | (uint64_t)b32[0] << 56;
    over = secp256k1_scalar_reduce(r, secp256k1_scalar_check_overflow(r));
    if (overflow) {
        *overflow = over;
    }
}